

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDMeshFragment * __thiscall
ON_SubDHeap::CopyMeshFragments
          (ON_SubDHeap *this,ON_SubDFace *source_face,uint destination_subd_display_density,
          ON_SubDFace *destination_face)

{
  ON_SubDMeshFragment *pOVar1;
  ON_SubDMeshFragment *dst_fragment;
  ON_SubDMeshFragment *src_fragment;
  ON_SubDMeshFragment *prev_dst_fragment;
  ON_SubDFace *destination_face_local;
  uint destination_subd_display_density_local;
  ON_SubDFace *source_face_local;
  ON_SubDHeap *this_local;
  
  if (((source_face == (ON_SubDFace *)0x0) || (destination_face == (ON_SubDFace *)0x0)) ||
     (destination_face->m_mesh_fragments != (ON_SubDMeshFragment *)0x0)) {
    ON_SubDIncrementErrorCount();
    this_local = (ON_SubDHeap *)0x0;
  }
  else {
    src_fragment = (ON_SubDMeshFragment *)0x0;
    dst_fragment = ON_SubDFace::MeshFragments(source_face);
    for (; dst_fragment != (ON_SubDMeshFragment *)0x0; dst_fragment = dst_fragment->m_next_fragment)
    {
      pOVar1 = AllocateMeshFragment(this,destination_subd_display_density,dst_fragment);
      pOVar1->m_face = destination_face;
      if (src_fragment == (ON_SubDMeshFragment *)0x0) {
        destination_face->m_mesh_fragments = pOVar1;
        ON_SubDComponentBase::Internal_SetSavedSurfacePointFlag
                  (&destination_face->super_ON_SubDComponentBase,true);
      }
      else {
        src_fragment->m_next_fragment = pOVar1;
      }
      src_fragment = pOVar1;
    }
    this_local = (ON_SubDHeap *)destination_face->m_mesh_fragments;
  }
  return (ON_SubDMeshFragment *)this_local;
}

Assistant:

ON_SubDMeshFragment* ON_SubDHeap::CopyMeshFragments(
  const ON_SubDFace* source_face,
  unsigned destination_subd_display_density,
  const ON_SubDFace* destination_face
)
{
  if (nullptr == source_face || nullptr == destination_face || nullptr != destination_face->m_mesh_fragments)
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON_SubDMeshFragment* prev_dst_fragment = nullptr;
  for (const ON_SubDMeshFragment* src_fragment = source_face->MeshFragments(); nullptr != src_fragment; src_fragment = src_fragment->m_next_fragment)
  {
    ON_SubDMeshFragment* dst_fragment = this->AllocateMeshFragment(destination_subd_display_density ,*src_fragment);
    dst_fragment->m_face = destination_face;
    if (prev_dst_fragment)
      prev_dst_fragment->m_next_fragment = dst_fragment;
    else
    {
      destination_face->m_mesh_fragments = dst_fragment;
      destination_face->Internal_SetSavedSurfacePointFlag(true);
    }
    prev_dst_fragment = dst_fragment;
  }
  return destination_face->m_mesh_fragments;
}